

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

Var Js::JavascriptString::EntryRepeat(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t count;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptString *pJVar7;
  double value;
  int in_stack_00000010;
  undefined1 local_50 [8];
  ArgumentReader args;
  JavascriptString *pThis;
  CallInfo local_30;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_30 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xa03,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bc10a7;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)local_50,&local_30,(Var *)&stack0x00000018);
  if ((local_50._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xa04,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00bc10a7;
    *puVar5 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_30 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xa07,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bc10a7:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  args.super_Arguments.Values = (Type)0x0;
  GetThisStringArgument
            ((ArgumentReader *)local_50,pSVar1,L"String.prototype.repeat",
             (JavascriptString **)&args.super_Arguments.Values);
  if ((local_50._0_4_ & 0xfffffe) != 0) {
    pvVar6 = Arguments::operator[]((Arguments *)local_50,1);
    bVar3 = TaggedInt::Is(pvVar6);
    pvVar6 = Arguments::operator[]((Arguments *)local_50,1);
    if (bVar3) {
      count = TaggedInt::ToInt32(pvVar6);
      if ((int)count < 0) {
LAB_00bc1016:
        JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ebf6,L"String.prototype.repeat");
      }
    }
    else {
      BVar4 = JavascriptOperators::IsUndefinedObject(pvVar6);
      if (BVar4 != 0) goto LAB_00bc108b;
      pvVar6 = Arguments::operator[]((Arguments *)local_50,1);
      value = JavascriptConversion::ToInteger_Full(pvVar6,pSVar1);
      bVar3 = JavascriptNumber::IsPosInf(value);
      if ((bVar3) || (value < 0.0)) goto LAB_00bc1016;
      count = NumberUtilities::LuFromDblNearest(value);
    }
    if ((count != 0) && (*(int *)(args.super_Arguments.Values + 3) != 0)) {
      if (count == 1) {
        return args.super_Arguments.Values;
      }
      pJVar7 = RepeatCore((JavascriptString *)args.super_Arguments.Values,count,pSVar1);
      return pJVar7;
    }
  }
LAB_00bc108b:
  pJVar7 = JavascriptLibrary::GetEmptyString((pSVar1->super_ScriptContextBase).javascriptLibrary);
  return pJVar7;
}

Assistant:

Var JavascriptString::EntryRepeat(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(String_Prototype_repeat);

        JavascriptString* pThis = nullptr;
        GetThisStringArgument(args, scriptContext, _u("String.prototype.repeat"), &pThis);

        charcount_t count = 0;

        if (args.Info.Count > 1)
        {
            if (TaggedInt::Is(args[1]))
            {
                int32 signedCount = TaggedInt::ToInt32(args[1]);
                if (signedCount < 0)
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("String.prototype.repeat"));
                }
                count = (uint32) signedCount;
            }
            else if (!JavascriptOperators::IsUndefinedObject(args[1]))
            {
                double countDbl = JavascriptConversion::ToInteger_Full(args[1], scriptContext);
                if (JavascriptNumber::IsPosInf(countDbl) || countDbl < 0.0)
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("String.prototype.repeat"));
                }

                count = NumberUtilities::LuFromDblNearest(countDbl);
            }
        }

        if (count == 0 || pThis->GetLength() == 0)
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }
        else if (count == 1)
        {
            return pThis;
        }

        return RepeatCore(pThis, count, scriptContext);
    }